

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_quake.cpp
# Opt level: O2

int DEarthquake::StaticGetQuakeIntensities(AActor *victim,FQuakeJiggers *jiggers)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  DEarthquake *this;
  AActor *pAVar4;
  TVector3<double> *this_00;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  int local_9c;
  undefined1 local_98 [16];
  double local_88;
  double local_78;
  double local_70;
  double local_68;
  TVector3<double> *local_58;
  TVector3<double> *local_50;
  TThinkerIterator<DEarthquake> iterator;
  
  if ((victim->player == (player_t *)0x0) || (local_9c = 0, (victim->player->cheats & 1) == 0)) {
    TThinkerIterator<DEarthquake>::TThinkerIterator
              ((TThinkerIterator<DEarthquake> *)&iterator.super_FThinkerIterator,0x28);
    local_50 = &jiggers->RelOffset;
    local_58 = &jiggers->Offset;
    local_9c = 0;
    while (this = (DEarthquake *)FThinkerIterator::Next(&iterator.super_FThinkerIterator,false),
          this != (DEarthquake *)0x0) {
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)&this->m_Spot);
      if (pAVar4 != (AActor *)0x0) {
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)&this->m_Spot);
        dVar5 = AActor::Distance2D(pAVar4,victim,true);
        if (dVar5 < this->m_TremorRadius) {
          local_9c = local_9c + 1;
          local_68 = GetFalloff(this,dVar5);
          local_78 = GetModIntensity(this,this->m_RollIntensity,false);
          local_70 = GetModIntensity(this,1.0,true);
          dVar5 = GetModIntensity(this,(this->m_Intensity).X,false);
          local_98._0_8_ = dVar5;
          dVar5 = GetModIntensity(this,(this->m_Intensity).Y,false);
          local_98._8_8_ = dVar5;
          local_88 = GetModIntensity(this,(this->m_Intensity).Z,false);
          uVar3 = this->m_Flags;
          if ((uVar3 & 0x20) == 0) {
            dVar5 = local_78;
            if (local_78 <= jiggers->RollIntensity) {
              dVar5 = jiggers->RollIntensity;
            }
            jiggers->RollIntensity = dVar5 * local_68;
            auVar6._0_8_ = local_68 * (double)local_98._0_8_;
            auVar6._8_8_ = local_68 * (double)local_98._8_8_;
            dVar5 = local_88 * local_68;
            if ((uVar3 & 1) == 0) {
              auVar1._0_8_ = (jiggers->Intensity).X;
              auVar1._8_8_ = (jiggers->Intensity).Y;
              auVar6 = maxpd(auVar6,auVar1);
              (jiggers->Intensity).X = (double)auVar6._0_8_;
              (jiggers->Intensity).Y = (double)auVar6._8_8_;
              dVar7 = (jiggers->Intensity).Z;
              if (dVar5 <= dVar7) {
                dVar5 = dVar7;
              }
              (jiggers->Intensity).Z = dVar5;
            }
            else {
              auVar2._0_8_ = (jiggers->RelIntensity).X;
              auVar2._8_8_ = (jiggers->RelIntensity).Y;
              auVar6 = maxpd(auVar6,auVar2);
              (jiggers->RelIntensity).X = (double)auVar6._0_8_;
              (jiggers->RelIntensity).Y = (double)auVar6._8_8_;
              dVar7 = (jiggers->RelIntensity).Z;
              if (dVar5 <= dVar7) {
                dVar5 = dVar7;
              }
              (jiggers->RelIntensity).Z = dVar5;
            }
          }
          else {
            dVar5 = GetModWave(this,this->m_RollWave);
            jiggers->RollWave = local_78 * dVar5 * local_68 * local_70;
            dVar5 = GetModWave(this,(this->m_WaveSpeed).X);
            local_98._0_8_ = dVar5 * (double)local_98._0_8_;
            dVar5 = GetModWave(this,(this->m_WaveSpeed).Y);
            local_98._8_8_ = dVar5 * (double)local_98._8_8_;
            dVar5 = GetModWave(this,(this->m_WaveSpeed).Z);
            dVar7 = local_68 * local_70;
            local_98._0_8_ = dVar7 * (double)local_98._0_8_;
            local_98._8_8_ = dVar7 * (double)local_98._8_8_;
            local_88 = dVar7 * dVar5 * local_88;
            this_00 = local_50;
            if ((this->m_Flags & 1) == 0) {
              this_00 = local_58;
            }
            TVector3<double>::operator+=(this_00,(TVector3<double> *)local_98);
          }
        }
      }
    }
  }
  return local_9c;
}

Assistant:

int DEarthquake::StaticGetQuakeIntensities(AActor *victim, FQuakeJiggers &jiggers)
{
	if (victim->player != NULL && (victim->player->cheats & CF_NOCLIP))
	{
		return 0;
	}

	TThinkerIterator<DEarthquake> iterator(STAT_EARTHQUAKE);
	DEarthquake *quake;
	int count = 0;

	while ( (quake = iterator.Next()) != nullptr)
	{
		if (quake->m_Spot != nullptr)
		{
			const double dist = quake->m_Spot->Distance2D(victim, true);
			if (dist < quake->m_TremorRadius)
			{
				++count;
				const double falloff = quake->GetFalloff(dist);
				const double r = quake->GetModIntensity(quake->m_RollIntensity);
				const double strength = quake->GetModIntensity(1.0, true);
				DVector3 intensity;
				intensity.X = quake->GetModIntensity(quake->m_Intensity.X);
				intensity.Y = quake->GetModIntensity(quake->m_Intensity.Y);
				intensity.Z = quake->GetModIntensity(quake->m_Intensity.Z);

				if (!(quake->m_Flags & QF_WAVE))
				{
					jiggers.RollIntensity = MAX(r, jiggers.RollIntensity) * falloff;

					intensity *= falloff;
					if (quake->m_Flags & QF_RELATIVE)
					{
						jiggers.RelIntensity.X = MAX(intensity.X, jiggers.RelIntensity.X);
						jiggers.RelIntensity.Y = MAX(intensity.Y, jiggers.RelIntensity.Y);
						jiggers.RelIntensity.Z = MAX(intensity.Z, jiggers.RelIntensity.Z);
					}
					else
					{
						jiggers.Intensity.X = MAX(intensity.X, jiggers.Intensity.X);
						jiggers.Intensity.Y = MAX(intensity.Y, jiggers.Intensity.Y);
						jiggers.Intensity.Z = MAX(intensity.Z, jiggers.Intensity.Z);
					}
				}
				else
				{
					jiggers.RollWave = r * quake->GetModWave(quake->m_RollWave) * falloff * strength;

					
					intensity.X *= quake->GetModWave(quake->m_WaveSpeed.X);
					intensity.Y *= quake->GetModWave(quake->m_WaveSpeed.Y);
					intensity.Z *= quake->GetModWave(quake->m_WaveSpeed.Z);
					intensity *= strength * falloff;

					// [RH] This only gives effect to the last sine quake. I would
					// prefer if some way was found to make multiples coexist
					// peacefully, but just summing them together is undesirable
					// because they could cancel each other out depending on their
					// relative phases.

					// [MC] Now does so. And they stack rather well. I'm a little
					// surprised at how easy it was.

					
					if (quake->m_Flags & QF_RELATIVE)
					{
						jiggers.RelOffset += intensity;
					}
					else
					{
						jiggers.Offset += intensity;
					}
				}
			}
		}
	}
	return count;
}